

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

Option * __thiscall CLI::Option::excludes(Option *this,Option *opt)

{
  OptionAlreadyAdded *__return_storage_ptr__;
  pair<std::_Rb_tree_iterator<CLI::Option_*>,_bool> pVar1;
  Option *opt_local;
  string local_58;
  string local_38;
  
  opt_local = opt;
  pVar1 = ::std::
          _Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
          ::_M_insert_unique<CLI::Option*const&>
                    ((_Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
                      *)&this->excludes_,&opt_local);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return this;
  }
  __return_storage_ptr__ = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
  get_name_abi_cxx11_(&local_38,this,false);
  get_name_abi_cxx11_(&local_58,opt_local,false);
  OptionAlreadyAdded::Excludes(__return_storage_ptr__,&local_38,&local_58);
  __cxa_throw(__return_storage_ptr__,&OptionAlreadyAdded::typeinfo,Error::~Error);
}

Assistant:

Option *excludes(Option *opt) {
        auto tup = excludes_.insert(opt);
        if(!tup.second)
            throw OptionAlreadyAdded::Excludes(get_name(), opt->get_name());
        return this;
    }